

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_z5_operators<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
                *matrix)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_12;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_c28;
  basic_cstring<const_char> local_c18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c08;
  assertion_result local_be8;
  basic_cstring<const_char> local_bd0;
  basic_cstring<const_char> local_bc0;
  basic_cstring<const_char> local_bb0;
  basic_cstring<const_char> local_ba0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b90;
  assertion_result local_b70;
  basic_cstring<const_char> local_b58;
  basic_cstring<const_char> local_b48;
  basic_cstring<const_char> local_b38;
  basic_cstring<const_char> local_b28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b18;
  assertion_result local_af8;
  basic_cstring<const_char> local_ae0;
  basic_cstring<const_char> local_ad0;
  basic_cstring<const_char> local_ac0;
  basic_cstring<const_char> local_ab0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_aa0;
  assertion_result local_a80;
  basic_cstring<const_char> local_a68;
  basic_cstring<const_char> local_a58;
  basic_cstring<const_char> local_a48;
  basic_cstring<const_char> local_a38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a28;
  assertion_result local_a08;
  basic_cstring<const_char> local_9f0;
  basic_cstring<const_char> local_9e0;
  basic_cstring<const_char> local_9d0;
  basic_cstring<const_char> local_9c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9b0;
  assertion_result local_990;
  basic_cstring<const_char> local_978;
  basic_cstring<const_char> local_968;
  uint local_958 [10];
  iterator local_930;
  undefined8 local_928;
  int local_920 [12];
  pair<unsigned_int,_unsigned_int> local_8f0;
  pair<unsigned_int,_unsigned_int> local_8e8;
  pair<unsigned_int,_unsigned_int> local_8e0;
  pair<unsigned_int,_unsigned_int> local_8d8;
  pair<unsigned_int,_unsigned_int> local_8d0;
  pair<unsigned_int,_unsigned_int> local_8c8;
  iterator local_8c0;
  undefined8 local_8b8;
  Field_element local_8ac;
  uint local_8a8 [10];
  iterator local_880;
  undefined8 local_878;
  int local_870 [12];
  pair<unsigned_int,_unsigned_int> local_840;
  pair<unsigned_int,_unsigned_int> local_838;
  pair<unsigned_int,_unsigned_int> local_830;
  pair<unsigned_int,_unsigned_int> local_828;
  pair<unsigned_int,_unsigned_int> local_820;
  pair<unsigned_int,_unsigned_int> local_818;
  iterator local_810;
  undefined8 local_808;
  Field_element local_7fc;
  uint local_7f8 [10];
  iterator local_7d0;
  undefined8 local_7c8;
  int local_7c0 [10];
  pair<unsigned_int,_unsigned_int> local_798;
  pair<unsigned_int,_unsigned_int> local_790;
  pair<unsigned_int,_unsigned_int> local_788;
  pair<unsigned_int,_unsigned_int> local_780;
  pair<unsigned_int,_unsigned_int> local_778;
  iterator local_770;
  undefined8 local_768;
  Field_element local_75c;
  uint local_758 [8];
  iterator local_738;
  undefined8 local_730;
  int local_728 [10];
  pair<unsigned_int,_unsigned_int> local_700;
  pair<unsigned_int,_unsigned_int> local_6f8;
  pair<unsigned_int,_unsigned_int> local_6f0;
  pair<unsigned_int,_unsigned_int> local_6e8;
  pair<unsigned_int,_unsigned_int> local_6e0;
  iterator local_6d8;
  undefined8 local_6d0;
  Field_element local_6c4;
  basic_cstring<const_char> local_6c0;
  basic_cstring<const_char> local_6b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6a0;
  assertion_result local_680;
  basic_cstring<const_char> local_668;
  basic_cstring<const_char> local_658;
  basic_cstring<const_char> local_648;
  basic_cstring<const_char> local_638;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_628;
  assertion_result local_608;
  basic_cstring<const_char> local_5f0;
  basic_cstring<const_char> local_5e0;
  basic_cstring<const_char> local_5d0;
  basic_cstring<const_char> local_5c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5b0;
  assertion_result local_590;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  basic_cstring<const_char> local_558;
  basic_cstring<const_char> local_548;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_538;
  assertion_result local_518;
  basic_cstring<const_char> local_500;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  basic_cstring<const_char> local_4d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4c0;
  assertion_result local_4a0;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  uint local_468 [8];
  iterator local_448;
  undefined8 local_440;
  int local_438 [10];
  pair<unsigned_int,_unsigned_int> local_410;
  pair<unsigned_int,_unsigned_int> local_408;
  pair<unsigned_int,_unsigned_int> local_400;
  pair<unsigned_int,_unsigned_int> local_3f8;
  pair<unsigned_int,_unsigned_int> local_3f0;
  iterator local_3e8;
  undefined8 local_3e0;
  uint local_3d8 [10];
  iterator local_3b0;
  undefined8 local_3a8;
  int local_3a0 [8];
  pair<unsigned_int,_unsigned_int> local_380;
  pair<unsigned_int,_unsigned_int> local_378;
  pair<unsigned_int,_unsigned_int> local_370;
  pair<unsigned_int,_unsigned_int> local_368;
  iterator local_360;
  undefined8 local_358;
  Field_element local_34c [3];
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  assertion_result local_300;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  basic_cstring<const_char> local_2b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2a8;
  assertion_result local_288;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_230;
  assertion_result local_210;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b8;
  assertion_result local_198;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_140;
  assertion_result local_120;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  uint local_e8 [8];
  iterator local_c8;
  undefined8 local_c0;
  int local_b8 [8];
  pair<unsigned_int,_unsigned_int> local_98;
  pair<unsigned_int,_unsigned_int> local_90;
  pair<unsigned_int,_unsigned_int> local_88;
  pair<unsigned_int,_unsigned_int> local_80;
  iterator local_78;
  undefined8 local_70;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  setcont;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
  *matrix_local;
  
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::set((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,1);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::operator+=(pvVar4,pvVar3);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,2);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::operator+=(pvVar4,pvVar3);
  local_b8[7] = 1;
  local_b8[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_98,local_b8 + 7,local_b8 + 6);
  local_b8[5] = 2;
  local_b8[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_90,local_b8 + 5,local_b8 + 4);
  local_b8[3] = 3;
  local_b8[2] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_88,local_b8 + 3,local_b8 + 2);
  local_b8[1] = 6;
  local_b8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_80,local_b8 + 1,local_b8);
  local_78 = &local_98;
  local_70 = 4;
  __l_12._M_len = 4;
  __l_12._M_array = local_78;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_12);
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 1;
  local_e8[0] = 0;
  local_e8[1] = 4;
  local_e8[2] = 1;
  local_e8[3] = 3;
  local_c8 = local_e8;
  local_c0 = 7;
  __l_11._M_len = 7;
  __l_11._M_array = local_c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_11);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x17a,&local_108);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_120,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,"matrix[1] == matrix[1]",0x16);
    boost::unit_test::operator<<(&local_140,plVar5,&local_150);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_120,&local_140,&local_160,0x17a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_140);
    boost::test_tools::assertion_result::~assertion_result(&local_120);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_180);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_170,0x17b,&local_180);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_198,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,"matrix[1] == matrix[3]",0x16);
    boost::unit_test::operator<<(&local_1b8,plVar5,&local_1c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_198,&local_1b8,&local_1d8,0x17b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1b8);
    boost::test_tools::assertion_result::~assertion_result(&local_198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x17c,&local_1f8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_210,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_230,plVar5,&local_240);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_210,&local_230,&local_250,0x17c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_230);
    boost::test_tools::assertion_result::~assertion_result(&local_210);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0x180,&local_270);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_288,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_2a8,plVar5,&local_2b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_288,&local_2a8,&local_2c8,0x180,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2a8);
    boost::test_tools::assertion_result::~assertion_result(&local_288);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d8,0x182,&local_2e8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_300,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_320,plVar5,&local_330);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_300,&local_320,&local_340,0x182,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_300);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_34c[2] = 4;
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::operator*=(pvVar3,local_34c + 2);
  local_34c[1] = 2;
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::operator*=(pvVar3,local_34c + 1);
  local_34c[0] = 1;
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::operator*=(pvVar3,local_34c);
  local_3a0[7] = 1;
  local_3a0[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_380,local_3a0 + 7,local_3a0 + 6);
  local_3a0[5] = 2;
  local_3a0[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_378,local_3a0 + 5,local_3a0 + 4);
  local_3a0[3] = 3;
  local_3a0[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_370,local_3a0 + 3,local_3a0 + 2);
  local_3a0[1] = 6;
  local_3a0[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_368,local_3a0 + 1,local_3a0);
  local_360 = &local_380;
  local_358 = 4;
  __l_10._M_len = 4;
  __l_10._M_array = local_360;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_10);
  local_3d8[4] = 0;
  local_3d8[5] = 0;
  local_3d8[6] = 4;
  local_3d8[0] = 0;
  local_3d8[1] = 1;
  local_3d8[2] = 4;
  local_3d8[3] = 2;
  local_3b0 = local_3d8;
  local_3a8 = 7;
  __l_09._M_len = 7;
  __l_09._M_array = local_3b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_09);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_438[9] = 0;
  local_438[8] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_410,local_438 + 9,local_438 + 8);
  local_438[7] = 1;
  local_438[6] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_408,local_438 + 7,local_438 + 6);
  local_438[5] = 2;
  local_438[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_400,local_438 + 5,local_438 + 4);
  local_438[3] = 5;
  local_438[2] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_3f8,local_438 + 3,local_438 + 2);
  local_438[1] = 6;
  local_438[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_3f0,local_438 + 1,local_438);
  local_3e8 = &local_410;
  local_3e0 = 5;
  __l_08._M_len = 5;
  __l_08._M_array = local_3e8;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_08);
  local_468[4] = 0;
  local_468[5] = 4;
  local_468[6] = 4;
  local_468[0] = 1;
  local_468[1] = 3;
  local_468[2] = 4;
  local_468[3] = 0;
  local_448 = local_468;
  local_440 = 7;
  __l_07._M_len = 7;
  __l_07._M_array = local_448;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_07);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,2);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_488);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_478,0x18e,&local_488);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_4a0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d0,"matrix[1] == matrix[1]",0x16);
    boost::unit_test::operator<<(&local_4c0,plVar5,&local_4d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4a0,&local_4c0,&local_4e0,0x18e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4c0);
    boost::test_tools::assertion_result::~assertion_result(&local_4a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_500);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4f0,399,&local_500);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_518,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_548,"matrix[1] == matrix[3]",0x16);
    boost::unit_test::operator<<(&local_538,plVar5,&local_548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_518,&local_538,&local_558,399,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_538);
    boost::test_tools::assertion_result::~assertion_result(&local_518);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_568,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_578);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_568,400,&local_578);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_590,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c0,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_5b0,plVar5,&local_5c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_590,&local_5b0,&local_5d0,400,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5b0);
    boost::test_tools::assertion_result::~assertion_result(&local_590);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5e0,0x194,&local_5f0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_608,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_638,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_628,plVar5,&local_638);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_648,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_608,&local_628,&local_648,0x194,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_628);
    boost::test_tools::assertion_result::~assertion_result(&local_608);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_668);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_658,0x196,&local_668);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_680,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b0,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_6a0,plVar5,&local_6b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_680,&local_6a0,&local_6c0,0x196,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6a0);
    boost::test_tools::assertion_result::~assertion_result(&local_680);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  local_6c4 = 4;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::multiply_target_and_add(pvVar3,&local_6c4,pvVar4);
  local_728[9] = 0;
  local_728[8] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_700,local_728 + 9,local_728 + 8);
  local_728[7] = 2;
  local_728[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6f8,local_728 + 7,local_728 + 6);
  local_728[5] = 3;
  local_728[4] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6f0,local_728 + 5,local_728 + 4);
  local_728[3] = 5;
  local_728[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6e8,local_728 + 3,local_728 + 2);
  local_728[1] = 6;
  local_728[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_6e0,local_728 + 1,local_728);
  local_6d8 = &local_700;
  local_6d0 = 5;
  __l_06._M_len = 5;
  __l_06._M_array = local_6d8;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_06);
  local_758[4] = 0;
  local_758[5] = 2;
  local_758[6] = 1;
  local_758[0] = 3;
  local_758[1] = 0;
  local_758[2] = 1;
  local_758[3] = 2;
  local_738 = local_758;
  local_730 = 7;
  __l_05._M_len = 7;
  __l_05._M_array = local_738;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_05);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  local_75c = 3;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_75c);
  local_7c0[9] = 0;
  local_7c0[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_798,local_7c0 + 9,local_7c0 + 8);
  local_7c0[7] = 1;
  local_7c0[6] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_790,local_7c0 + 7,local_7c0 + 6);
  local_7c0[5] = 2;
  local_7c0[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_788,local_7c0 + 5,local_7c0 + 4);
  local_7c0[3] = 5;
  local_7c0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_780,local_7c0 + 3,local_7c0 + 2);
  local_7c0[1] = 6;
  local_7c0[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_778,local_7c0 + 1,local_7c0);
  local_770 = &local_798;
  local_768 = 5;
  __l_04._M_len = 5;
  __l_04._M_array = local_770;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_04);
  local_7f8[4] = 0;
  local_7f8[5] = 1;
  local_7f8[6] = 1;
  local_7f8[0] = 4;
  local_7f8[1] = 2;
  local_7f8[2] = 1;
  local_7f8[3] = 0;
  local_7d0 = local_7f8;
  local_7c8 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_7d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_03);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  local_7fc = 3;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_7fc);
  local_870[0xb] = 0;
  local_870[10] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_840,local_870 + 0xb,local_870 + 10);
  local_870[9] = 1;
  local_870[8] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_838,local_870 + 9,local_870 + 8);
  local_870[7] = 2;
  local_870[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_830,local_870 + 7,local_870 + 6);
  local_870[5] = 3;
  local_870[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_828,local_870 + 5,local_870 + 4);
  local_870[3] = 5;
  local_870[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_820,local_870 + 3,local_870 + 2);
  local_870[1] = 6;
  local_870[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_818,local_870 + 1,local_870);
  local_810 = &local_840;
  local_808 = 6;
  __l_02._M_len = 6;
  __l_02._M_array = local_810;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_02);
  local_8a8[4] = 0;
  local_8a8[5] = 2;
  local_8a8[6] = 4;
  local_8a8[0] = 3;
  local_8a8[1] = 2;
  local_8a8[2] = 4;
  local_8a8[3] = 1;
  local_880 = local_8a8;
  local_878 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_880;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_01);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  local_8ac = 4;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::multiply_target_and_add(pvVar3,&local_8ac,pvVar4);
  local_920[0xb] = 0;
  local_920[10] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8f0,local_920 + 0xb,local_920 + 10);
  local_920[9] = 1;
  local_920[8] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8e8,local_920 + 9,local_920 + 8);
  local_920[7] = 2;
  local_920[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8e0,local_920 + 7,local_920 + 6);
  local_920[5] = 3;
  local_920[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8d8,local_920 + 5,local_920 + 4);
  local_920[3] = 5;
  local_920[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8d0,local_920 + 3,local_920 + 2);
  local_920[1] = 6;
  local_920[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_8c8,local_920 + 1,local_920);
  local_8c0 = &local_8f0;
  local_8b8 = 6;
  __l_00._M_len = 6;
  __l_00._M_array = local_8c0;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_00);
  local_958[4] = 0;
  local_958[5] = 2;
  local_958[6] = 4;
  local_958[0] = 3;
  local_958[1] = 2;
  local_958[2] = 4;
  local_958[3] = 1;
  local_930 = local_958;
  local_928 = 7;
  __l._M_len = 7;
  __l._M_array = local_930;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_968,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_978);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_968,0x1ac,&local_978);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_990,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,"matrix[3] == matrix[5]",0x16);
    boost::unit_test::operator<<(&local_9b0,plVar5,&local_9c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_990,&local_9b0,&local_9d0,0x1ac,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9b0);
    boost::test_tools::assertion_result::~assertion_result(&local_990);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9e0,0x1ad,&local_9f0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_a08,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a38,"!(matrix[5] == matrix[4])",0x19);
    boost::unit_test::operator<<(&local_a28,plVar5,&local_a38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a08,&local_a28,&local_a48,0x1ad,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a28);
    boost::test_tools::assertion_result::~assertion_result(&local_a08);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a68);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a58,0x1ae,&local_a68);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_a80,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab0,"!(matrix[5] < matrix[3])",0x18);
    boost::unit_test::operator<<(&local_aa0,plVar5,&local_ab0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ac0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a80,&local_aa0,&local_ac0,0x1ae,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_aa0);
    boost::test_tools::assertion_result::~assertion_result(&local_a80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ad0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ae0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ad0,0x1af,&local_ae0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_af8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b28,"!(matrix[3] < matrix[5])",0x18);
    boost::unit_test::operator<<(&local_b18,plVar5,&local_b28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_af8,&local_b18,&local_b38,0x1af,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b18);
    boost::test_tools::assertion_result::~assertion_result(&local_af8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b48,0x1b4,&local_b58);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_b70,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ba0,"matrix[5] < matrix[4]",0x15);
    boost::unit_test::operator<<(&local_b90,plVar5,&local_ba0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_b70,&local_b90,&local_bb0,0x1b4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b90);
    boost::test_tools::assertion_result::~assertion_result(&local_b70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bc0,0x1b5,&local_bd0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_be8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c18,"matrix[3] < matrix[4]",0x15);
    boost::unit_test::operator<<(&local_c08,plVar5,&local_c18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_be8,&local_c08,&local_c28,0x1b5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c08);
    boost::test_tools::assertion_result::~assertion_result(&local_be8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~set((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void column_test_common_z5_operators(std::vector<Column>& matrix) {
  std::set<std::pair<unsigned int, typename Column::Field_element> > setcont;
  std::vector<typename Column::Field_element> veccont;

  matrix[0] += matrix[1];
  matrix[1] += matrix[2];

  setcont = {{1, 4}, {2, 1}, {3, 3}, {6, 1}};
  veccont = {0, 4, 1, 3, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  matrix[0] *= 4;
  matrix[1] *= 2;
  matrix[2] *= 1;

  setcont = {{1, 1}, {2, 4}, {3, 2}, {6, 4}};
  veccont = {0, 1, 4, 2, 0, 0, 4};
  column_test_common_content_access(matrix[0], setcont, veccont);
  setcont = {{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}};
  veccont = {1, 3, 4, 0, 0, 4, 4};
  column_test_common_content_access(matrix[2], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, matrix[5]);
  setcont = {{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}};
  veccont = {3, 0, 1, 2, 0, 2, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[3], 3);
  setcont = {{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}};
  veccont = {4, 2, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[4], 3);
  setcont = {{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}};
  veccont = {3, 2, 4, 1, 0, 2, 4};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = v * this + column
  matrix[3].multiply_target_and_add(4, matrix[5]);
  setcont = {{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}};
  veccont = {3, 2, 4, 1, 0, 2, 4};
  column_test_common_content_access(matrix[3], setcont, veccont);
  BOOST_CHECK(matrix[3] == matrix[5]);
  BOOST_CHECK(!(matrix[5] == matrix[4]));
  BOOST_CHECK(!(matrix[5] < matrix[3]));
  BOOST_CHECK(!(matrix[3] < matrix[5]));
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[4] < matrix[5]);
    BOOST_CHECK(matrix[4] < matrix[3]);
  } else {
    BOOST_CHECK(matrix[5] < matrix[4]);
    BOOST_CHECK(matrix[3] < matrix[4]);
  }
}